

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool-options.h
# Opt level: O0

void __thiscall
wasm::ToolOptions::ToolOptions(ToolOptions *this,string *command,string *description)

{
  string *psVar1;
  ToolOptions *pTVar2;
  anon_class_8_1_8991fb9c local_c38;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_c30;
  allocator<char> local_c09;
  string local_c08 [39];
  allocator<char> local_be1;
  string local_be0 [39];
  allocator<char> local_bb9;
  string local_bb8 [39];
  allocator<char> local_b91;
  string local_b90 [39];
  anon_class_1_0_00000001 local_b69;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b68;
  allocator<char> local_b41;
  string local_b40 [39];
  allocator<char> local_b19;
  string local_b18 [39];
  allocator<char> local_af1;
  string local_af0 [39];
  allocator<char> local_ac9;
  string local_ac8 [39];
  anon_class_1_0_00000001 local_aa1;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_aa0;
  allocator<char> local_a79;
  string local_a78 [39];
  allocator<char> local_a51;
  string local_a50 [39];
  allocator<char> local_a29;
  string local_a28 [39];
  allocator<char> local_a01;
  string local_a00 [32];
  anon_class_8_1_8991fb9c local_9e0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_9d8;
  allocator<char> local_9b1;
  string local_9b0 [39];
  allocator<char> local_989;
  string local_988 [39];
  allocator<char> local_961;
  string local_960 [39];
  allocator<char> local_939;
  string local_938 [32];
  anon_class_8_1_8991fb9c local_918;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_910;
  allocator<char> local_8e9;
  string local_8e8 [39];
  allocator<char> local_8c1;
  string local_8c0 [39];
  allocator<char> local_899;
  string local_898 [39];
  allocator<char> local_871;
  string local_870 [39];
  anon_class_1_0_00000001 local_849;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_848;
  allocator<char> local_821;
  string local_820 [39];
  allocator<char> local_7f9;
  string local_7f8 [39];
  allocator<char> local_7d1;
  string local_7d0 [39];
  allocator<char> local_7a9;
  string local_7a8 [39];
  anon_class_1_0_00000001 local_781;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_780;
  allocator<char> local_759;
  string local_758 [39];
  allocator<char> local_731;
  string local_730 [39];
  allocator<char> local_709;
  string local_708 [39];
  allocator<char> local_6e1;
  string local_6e0 [39];
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  allocator<char> local_619;
  string local_618;
  allocator<char> local_5f1;
  string local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  allocator<char> local_579;
  string local_578;
  allocator<char> local_551;
  string local_550;
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  anon_class_8_1_8991fb9c local_418;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_410;
  allocator<char> local_3e9;
  string local_3e8 [39];
  allocator<char> local_3c1;
  string local_3c0 [39];
  allocator<char> local_399;
  string local_398 [39];
  allocator<char> local_371;
  string local_370 [32];
  anon_class_8_1_8991fb9c local_350;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_348;
  allocator<char> local_321;
  string local_320 [39];
  allocator<char> local_2f9;
  string local_2f8 [39];
  allocator<char> local_2d1;
  string local_2d0 [39];
  allocator<char> local_2a9;
  string local_2a8 [39];
  anon_class_1_0_00000001 local_281;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_280;
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  string local_230 [39];
  allocator<char> local_209;
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [32];
  anon_class_8_1_8991fb9c local_1c0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1b8;
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [32];
  anon_class_8_1_8991fb9c local_f8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_f0;
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [39];
  allocator<char> local_51;
  string local_50 [48];
  string *local_20;
  string *description_local;
  string *command_local;
  ToolOptions *this_local;
  
  local_20 = description;
  description_local = command;
  command_local = (string *)this;
  wasm::Options::Options(&this->super_Options,(string *)command,(string *)description);
  PassOptions::PassOptions(&this->passOptions);
  this->quiet = false;
  this->profile = Normal;
  FeatureSet::FeatureSet(&this->enabledFeatures,0x22);
  FeatureSet::FeatureSet(&this->disabledFeatures,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"--mvp-features",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"-mvp",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"Disable all non-MVP features",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"Tool options",&local_c9);
  local_f8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_1_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_f0,&local_f8);
  psVar1 = (string *)
           wasm::Options::add((string *)this,local_50,local_78,local_a0,(Arguments)local_c8,
                              (function *)0x0,SUB81(&local_f0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"--all-features",&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"-all",&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"Enable all features",&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"Tool options",&local_191);
  local_1c0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_2_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1b8,&local_1c0);
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_118,local_140,local_168,(Arguments)local_190,
                              (function *)0x0,SUB81(&local_1b8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"--detect-features",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_208,"",&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_230,"(deprecated - this flag does nothing)",&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_258,"Tool options",&local_259);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_3_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_280,&local_281);
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_1e0,local_208,local_230,(Arguments)local_258,
                              (function *)0x0,SUB81(&local_280,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"--quiet",&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"-q",&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2f8,"Emit less verbose output and hide trivial warnings.",&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_320,"Tool options",&local_321);
  local_350.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_4_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_348,&local_350);
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_2a8,local_2d0,local_2f8,(Arguments)local_320,
                              (function *)0x0,SUB81(&local_348,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_370,"--experimental-poppy",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_398,"",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3c0,"Parse wast files as Poppy IR for testing purposes.",&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3e8,"Tool options",&local_3e9);
  local_418.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_5_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_410,&local_418);
  wasm::Options::add(psVar1,local_370,local_398,local_3c0,(Arguments)local_3e8,(function *)0x0,
                     SUB81(&local_410,0));
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_410);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator(&local_371);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_348);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator(&local_321);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_280);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1b8);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_f0);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"sign extension operations",&local_439);
  pTVar2 = addFeature(this,SignExt,&local_438);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"atomic operations",&local_461);
  pTVar2 = addFeature(pTVar2,Atomics,&local_460);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,"mutable globals",&local_489);
  pTVar2 = addFeature(pTVar2,MutableGlobals,&local_488);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"nontrapping float-to-int operations",&local_4b1);
  pTVar2 = addFeature(pTVar2,TruncSat,&local_4b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,"SIMD operations and types",&local_4d9);
  pTVar2 = addFeature(pTVar2,SIMD,&local_4d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,"bulk memory operations",&local_501);
  pTVar2 = addFeature(pTVar2,BulkMemory,&local_500);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"exception handling operations",&local_529);
  pTVar2 = addFeature(pTVar2,ExceptionHandling,&local_528);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"tail call operations",&local_551);
  pTVar2 = addFeature(pTVar2,TailCall,&local_550);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_578,"reference types",&local_579);
  pTVar2 = addFeature(pTVar2,ReferenceTypes,&local_578);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a0,"multivalue functions",&local_5a1);
  pTVar2 = addFeature(pTVar2,Multivalue,&local_5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c8,"garbage collection",&local_5c9);
  pTVar2 = addFeature(pTVar2,GC,&local_5c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f0,"memory64",&local_5f1);
  pTVar2 = addFeature(pTVar2,Memory64,&local_5f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_618,"GC non-null locals",&local_619);
  pTVar2 = addFeature(pTVar2,GCNNLocals,&local_618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_640,"relaxed SIMD",&local_641)
  ;
  pTVar2 = addFeature(pTVar2,RelaxedSIMD,&local_640);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,"extended const expressions",&local_669);
  pTVar2 = addFeature(pTVar2,ExtendedConst,&local_668);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"strings",&local_691);
  pTVar2 = addFeature(pTVar2,Strings,&local_690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b8,"multi-memories",&local_6b9);
  pTVar2 = addFeature(pTVar2,MultiMemories,&local_6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6e0,"--enable-typed-function-references",&local_6e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_708,"",&local_709);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_730,"Deprecated compatibility flag",&local_731);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_758,"Tool options",&local_759);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_6_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_780,&local_781);
  psVar1 = (string *)
           wasm::Options::add((string *)pTVar2,local_6e0,local_708,local_730,(Arguments)local_758,
                              (function *)0x0,SUB81(&local_780,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_7a8,"--disable-typed-function-references",&local_7a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7d0,"",&local_7d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_7f8,"Deprecated compatibility flag",&local_7f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_820,"Tool options",&local_821);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_7_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_848,&local_849);
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_7a8,local_7d0,local_7f8,(Arguments)local_820,
                              (function *)0x0,SUB81(&local_848,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_870,"--no-validation",&local_871);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_898,"-n",&local_899);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_8c0,"Disables validation, assumes inputs are correct",&local_8c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8e8,"Tool options",&local_8e9);
  local_918.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_8_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_910,&local_918);
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_870,local_898,local_8c0,(Arguments)local_8e8,
                              (function *)0x0,SUB81(&local_910,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_938,"--pass-arg",&local_939);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_960,"-pa",&local_961);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_988,
             "An argument passed along to optimization passes being run. Must be in the form KEY@VALUE"
             ,&local_989);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9b0,"Tool options",&local_9b1);
  local_9e0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_9_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_9d8,&local_9e0);
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_938,local_960,local_988,(Arguments)local_9b0,
                              (function *)0x2,SUB81(&local_9d8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a00,"--nominal",&local_a01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a28,"",&local_a29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a50,"Force all GC type definitions to be parsed as nominal.",&local_a51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a78,"Tool options",&local_a79);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_10_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_aa0,&local_aa1);
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_a00,local_a28,local_a50,(Arguments)local_a78,
                              (function *)0x0,SUB81(&local_aa0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ac8,"--hybrid",&local_ac9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_af0,"",&local_af1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b18,
             "Force all GC type definitions to be parsed using the isorecursive hybrid type system."
             ,&local_b19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b40,"Tool options",&local_b41);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_11_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_b68,&local_b69);
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_ac8,local_af0,local_b18,(Arguments)local_b40,
                              (function *)0x0,SUB81(&local_b68,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b90,"--closed-world",&local_b91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_bb8,"-cw",&local_bb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_be0,
             "Assume code outside of the module does not inspect or interact with GC and function references, even if they are passed out. The outside may hold on to them and pass them back in, but not inspect their contents or call them."
             ,&local_be1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c08,"Tool options",&local_c09);
  local_c38.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_12_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_c30,&local_c38);
  wasm::Options::add(psVar1,local_b90,local_bb8,local_be0,(Arguments)local_c08,(function *)0x0,
                     SUB81(&local_c30,0));
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_c30);
  std::__cxx11::string::~string(local_c08);
  std::allocator<char>::~allocator(&local_c09);
  std::__cxx11::string::~string(local_be0);
  std::allocator<char>::~allocator(&local_be1);
  std::__cxx11::string::~string(local_bb8);
  std::allocator<char>::~allocator(&local_bb9);
  std::__cxx11::string::~string(local_b90);
  std::allocator<char>::~allocator(&local_b91);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_b68);
  std::__cxx11::string::~string(local_b40);
  std::allocator<char>::~allocator(&local_b41);
  std::__cxx11::string::~string(local_b18);
  std::allocator<char>::~allocator(&local_b19);
  std::__cxx11::string::~string(local_af0);
  std::allocator<char>::~allocator(&local_af1);
  std::__cxx11::string::~string(local_ac8);
  std::allocator<char>::~allocator(&local_ac9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_aa0);
  std::__cxx11::string::~string(local_a78);
  std::allocator<char>::~allocator(&local_a79);
  std::__cxx11::string::~string(local_a50);
  std::allocator<char>::~allocator(&local_a51);
  std::__cxx11::string::~string(local_a28);
  std::allocator<char>::~allocator(&local_a29);
  std::__cxx11::string::~string(local_a00);
  std::allocator<char>::~allocator(&local_a01);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_9d8);
  std::__cxx11::string::~string(local_9b0);
  std::allocator<char>::~allocator(&local_9b1);
  std::__cxx11::string::~string(local_988);
  std::allocator<char>::~allocator(&local_989);
  std::__cxx11::string::~string(local_960);
  std::allocator<char>::~allocator(&local_961);
  std::__cxx11::string::~string(local_938);
  std::allocator<char>::~allocator(&local_939);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_910);
  std::__cxx11::string::~string(local_8e8);
  std::allocator<char>::~allocator(&local_8e9);
  std::__cxx11::string::~string(local_8c0);
  std::allocator<char>::~allocator(&local_8c1);
  std::__cxx11::string::~string(local_898);
  std::allocator<char>::~allocator(&local_899);
  std::__cxx11::string::~string(local_870);
  std::allocator<char>::~allocator(&local_871);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_848);
  std::__cxx11::string::~string(local_820);
  std::allocator<char>::~allocator(&local_821);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  std::__cxx11::string::~string(local_7d0);
  std::allocator<char>::~allocator(&local_7d1);
  std::__cxx11::string::~string(local_7a8);
  std::allocator<char>::~allocator(&local_7a9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_780);
  std::__cxx11::string::~string(local_758);
  std::allocator<char>::~allocator(&local_759);
  std::__cxx11::string::~string(local_730);
  std::allocator<char>::~allocator(&local_731);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator(&local_709);
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator(&local_669);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator(&local_641);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator(&local_619);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::allocator<char>::~allocator(&local_5a1);
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator(&local_579);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator(&local_551);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
  return;
}

Assistant:

ToolOptions(const std::string& command, const std::string& description)
    : Options(command, description) {
    (*this)
      .add("--mvp-features",
           "-mvp",
           "Disable all non-MVP features",
           ToolOptionsCategory,
           Arguments::Zero,
           [this](Options*, const std::string&) {
             enabledFeatures.setMVP();
             disabledFeatures.setAll();
           })
      .add("--all-features",
           "-all",
           "Enable all features",
           ToolOptionsCategory,
           Arguments::Zero,
           [this](Options*, const std::string&) {
             enabledFeatures.setAll();
             disabledFeatures.setMVP();
           })
      .add("--detect-features",
           "",
           "(deprecated - this flag does nothing)",
           ToolOptionsCategory,
           Arguments::Zero,
           [](Options*, const std::string&) {})
      .add("--quiet",
           "-q",
           "Emit less verbose output and hide trivial warnings.",
           ToolOptionsCategory,
           Arguments::Zero,
           [this](Options*, const std::string&) { quiet = true; })
      .add(
        "--experimental-poppy",
        "",
        "Parse wast files as Poppy IR for testing purposes.",
        ToolOptionsCategory,
        Arguments::Zero,
        [this](Options*, const std::string&) { profile = IRProfile::Poppy; });
    (*this)
      .addFeature(FeatureSet::SignExt, "sign extension operations")
      .addFeature(FeatureSet::Atomics, "atomic operations")
      .addFeature(FeatureSet::MutableGlobals, "mutable globals")
      .addFeature(FeatureSet::TruncSat, "nontrapping float-to-int operations")
      .addFeature(FeatureSet::SIMD, "SIMD operations and types")
      .addFeature(FeatureSet::BulkMemory, "bulk memory operations")
      .addFeature(FeatureSet::ExceptionHandling,
                  "exception handling operations")
      .addFeature(FeatureSet::TailCall, "tail call operations")
      .addFeature(FeatureSet::ReferenceTypes, "reference types")
      .addFeature(FeatureSet::Multivalue, "multivalue functions")
      .addFeature(FeatureSet::GC, "garbage collection")
      .addFeature(FeatureSet::Memory64, "memory64")
      .addFeature(FeatureSet::GCNNLocals, "GC non-null locals")
      .addFeature(FeatureSet::RelaxedSIMD, "relaxed SIMD")
      .addFeature(FeatureSet::ExtendedConst, "extended const expressions")
      .addFeature(FeatureSet::Strings, "strings")
      .addFeature(FeatureSet::MultiMemories, "multi-memories")
      .add("--enable-typed-function-references",
           "",
           "Deprecated compatibility flag",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [](Options* o, const std::string& argument) {
             std::cerr
               << "Warning: Typed function references have been made part of "
                  "GC and --enable-typed-function-references is deprecated\n";
           })
      .add("--disable-typed-function-references",
           "",
           "Deprecated compatibility flag",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [](Options* o, const std::string& argument) {
             std::cerr
               << "Warning: Typed function references have been made part of "
                  "GC and --disable-typed-function-references is deprecated\n";
           })
      .add("--no-validation",
           "-n",
           "Disables validation, assumes inputs are correct",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [this](Options* o, const std::string& argument) {
             passOptions.validate = false;
           })
      .add("--pass-arg",
           "-pa",
           "An argument passed along to optimization passes being run. Must be "
           "in the form KEY@VALUE",
           ToolOptionsCategory,
           Options::Arguments::N,
           [this](Options*, const std::string& argument) {
             std::string key, value;
             auto colon = argument.find('@');
             if (colon == std::string::npos) {
               key = argument;
               value = "1";
             } else {
               key = argument.substr(0, colon);
               value = argument.substr(colon + 1);
             }
             passOptions.arguments[key] = value;
           })
      .add("--nominal",
           "",
           "Force all GC type definitions to be parsed as nominal.",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [](Options* o, const std::string& argument) {
             setTypeSystem(TypeSystem::Nominal);
           })
      .add("--hybrid",
           "",
           "Force all GC type definitions to be parsed using the isorecursive "
           "hybrid type system.",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [](Options* o, const std::string& argument) {
             setTypeSystem(TypeSystem::Isorecursive);
           })
      .add(
        "--closed-world",
        "-cw",
        "Assume code outside of the module does not inspect or interact with "
        "GC and function references, even if they are passed out. The outside "
        "may hold on to them and pass them back in, but not inspect their "
        "contents or call them.",
        ToolOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) {
          passOptions.closedWorld = true;
        });
  }